

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O3

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  __m128 *pafVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  undefined8 *puVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  binary_op_pow op;
  __m128 _b0;
  __m128 _p_1;
  __m256 _b0_avx;
  binary_op_pow local_10d;
  int local_10c;
  ulong local_108;
  Mat *local_100;
  Mat *local_f8;
  Mat *local_f0;
  ulong local_e8;
  __m128 local_e0;
  float afStack_d0 [2];
  float afStack_c8 [6];
  float local_b0 [2];
  float afStack_a8 [2];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  local_108 = (ulong)(uint)a->c;
  local_10c = a->h * a->w * a->d * a->elempack;
  local_f8 = a;
  local_f0 = b;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar4 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_108) {
      local_e8 = 0;
      local_100 = c;
      do {
        pafVar2 = (__m128 *)(local_f8->cstep * local_e8 * local_f8->elemsize + (long)local_f8->data)
        ;
        puVar7 = (undefined8 *)
                 (local_100->cstep * local_e8 * local_100->elemsize + (long)local_100->data);
        local_a0 = *local_f0->data;
        fStack_9c = local_a0;
        fStack_98 = local_a0;
        fStack_94 = local_a0;
        fStack_90 = local_a0;
        fStack_8c = local_a0;
        fStack_88 = local_a0;
        fStack_84 = local_a0;
        local_80 = local_a0;
        fStack_7c = local_a0;
        fStack_78 = local_a0;
        fStack_74 = local_a0;
        fStack_70 = local_a0;
        fStack_6c = local_a0;
        fStack_68 = local_a0;
        fStack_64 = local_a0;
        if (local_10c < 8) {
          uVar5 = 0;
        }
        else {
          uVar3 = 0;
          do {
            uVar10 = *(undefined8 *)*pafVar2;
            uVar9 = *(undefined8 *)(*pafVar2 + 2);
            local_e0 = *pafVar2;
            uVar11 = *(undefined8 *)pafVar2[1];
            uVar12 = *(undefined8 *)(pafVar2[1] + 2);
            afStack_d0 = (float  [2])uVar11;
            afStack_c8._0_8_ = uVar12;
            BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                      (&local_10d,(__m256 *)local_e0,(__m256 *)&local_80);
            *puVar7 = uVar10;
            puVar7[1] = uVar9;
            puVar7[2] = uVar11;
            puVar7[3] = uVar12;
            pafVar2 = pafVar2 + 2;
            puVar7 = puVar7 + 4;
            uVar5 = uVar3 + 8;
            iVar4 = uVar3 + 0xf;
            uVar3 = uVar5;
          } while (iVar4 < local_10c);
        }
        auVar1._4_4_ = fStack_9c;
        auVar1._0_4_ = local_a0;
        auVar1._8_4_ = fStack_98;
        auVar1._12_4_ = fStack_94;
        local_e0 = (__m128)vpermilps_avx(auVar1,0);
        uVar3 = uVar5;
        if ((int)(uVar5 | 3) < local_10c) {
          do {
            local_b0 = *(float (*) [2])*pafVar2;
            uVar10 = *(undefined8 *)(*pafVar2 + 2);
            afStack_a8 = (float  [2])uVar10;
            afVar13 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                (&local_10d,(__m128 *)local_b0,&local_e0);
            *puVar7 = afVar13._0_8_;
            puVar7[1] = uVar10;
            pafVar2 = pafVar2 + 1;
            puVar7 = puVar7 + 2;
            uVar5 = uVar3 + 4;
            iVar4 = uVar3 + 7;
            uVar3 = uVar5;
          } while (iVar4 < local_10c);
        }
        iVar4 = local_10c - uVar5;
        if ((int)uVar5 < local_10c) {
          lVar6 = 0;
          do {
            fVar8 = powf((*pafVar2)[lVar6],local_a0);
            *(float *)((long)puVar7 + lVar6 * 4) = fVar8;
            lVar6 = lVar6 + 1;
          } while (iVar4 != (int)lVar6);
        }
        local_e8 = local_e8 + 1;
      } while (local_e8 != local_108);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}